

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O1

void duckdb::ApproxTopKFinalize<duckdb::HistogramStringFunctor>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong *puVar1;
  pointer prVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  idx_t size;
  InternalApproxTopKState *pIVar8;
  Vector *this_00;
  pointer prVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  string_t sVar17;
  UnifiedVectorFormat sdata;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  buffer_ptr<ValidityBuffer> *local_a8;
  Vector *local_a0;
  ulong local_98;
  data_ptr_t local_90;
  idx_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_88 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  lVar16 = 0;
  if (count != 0) {
    uVar15 = 0;
    do {
      uVar11 = uVar15;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)(local_78.sel)->sel_vector[uVar15];
      }
      pIVar8 = ApproxTopKState::GetState(*(ApproxTopKState **)(local_78.data + uVar11 * 8));
      prVar9 = (pIVar8->values).
               super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      prVar2 = (pIVar8->values).
               super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (prVar9 != prVar2) {
        uVar11 = (long)prVar2 - (long)prVar9 >> 3;
        if (pIVar8->k <= uVar11) {
          uVar11 = pIVar8->k;
        }
        lVar16 = lVar16 + uVar11;
      }
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  local_90 = local_78.data;
  ListVector::Reserve(result,lVar16 + size);
  pdVar3 = result->data;
  this_00 = ListVector::GetEntry(result);
  if (count != 0) {
    local_a8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar15 = 0;
    local_a0 = result;
    local_98 = count;
    do {
      uVar11 = uVar15;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)(local_78.sel)->sel_vector[uVar15];
      }
      pIVar8 = ApproxTopKState::GetState(*(ApproxTopKState **)(local_90 + uVar11 * 8));
      uVar11 = uVar15 + local_88;
      if ((pIVar8->values).
          super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (pIVar8->values).
          super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var7 = p_Stack_b0;
          peVar6 = local_b8;
          local_b8 = (element_type *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar6;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_a8);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar11 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar11 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      else {
        *(idx_t *)(pdVar3 + uVar11 * 0x10) = size;
        prVar9 = (pIVar8->values).
                 super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(pIVar8->values).
                       super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                       .
                       super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)prVar9 >> 3;
        if (pIVar8->k <= uVar12) {
          uVar12 = pIVar8->k;
        }
        if (uVar12 != 0) {
          lVar16 = size << 4;
          uVar13 = 0;
          do {
            sVar17.value.pointer.ptr = (char *)uVar12;
            sVar17.value._0_8_ = *(undefined8 *)((long)&((prVar9[uVar13]._M_data)->str_val).str + 8)
            ;
            sVar17 = StringVector::AddStringOrBlob
                               ((StringVector *)this_00,
                                *(Vector **)&((prVar9[uVar13]._M_data)->str_val).str.value,sVar17);
            pdVar4 = this_00->data;
            *(long *)(pdVar4 + lVar16) = sVar17.value._0_8_;
            *(long *)(pdVar4 + lVar16 + 8) = sVar17.value._8_8_;
            uVar13 = uVar13 + 1;
            prVar9 = (pIVar8->values).
                     super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar12 = (long)(pIVar8->values).
                           super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                           .
                           super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)prVar9 >> 3;
            if (pIVar8->k <= uVar12) {
              uVar12 = pIVar8->k;
            }
            lVar16 = lVar16 + 0x10;
          } while (uVar13 < uVar12);
          size = size + uVar13;
          count = local_98;
          result = local_a0;
        }
        plVar14 = (long *)(pdVar3 + uVar11 * 0x10);
        plVar14[1] = size - *plVar14;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != count);
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ApproxTopKFinalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<ApproxTopKState *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = states[sdata.sel->get_index(i)]->GetState();
		if (state.values.empty()) {
			continue;
		}
		// get up to k values for each state
		// this can be less of fewer unique values were found
		new_entries += MinValue<idx_t>(state.values.size(), state.k);
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto &child_data = ListVector::GetEntry(result);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = states[sdata.sel->get_index(i)]->GetState();
		if (state.values.empty()) {
			mask.SetInvalid(rid);
			continue;
		}
		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t val_idx = 0; val_idx < MinValue<idx_t>(state.values.size(), state.k); val_idx++) {
			auto &val = state.values[val_idx].get();
			D_ASSERT(val.count > 0);
			OP::template HistogramFinalize<string_t>(val.str_val.str, child_data, current_offset);
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}